

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

string * SHA256AutoDetect_abi_cxx11_
                   (string *__return_storage_ptr__,UseImplementation use_implementation)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined1 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  uint in_XCR0;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint32_t state [8];
  uchar out [32];
  uchar local_158 [256];
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"standard","");
  (anonymous_namespace)::Transform = anon_unknown.dwarf_5b1c29d::sha256::Transform;
  (anonymous_namespace)::TransformD64 = anon_unknown.dwarf_5b1c29d::sha256::TransformD64;
  (anonymous_namespace)::TransformD64_2way = (code *)0x0;
  (anonymous_namespace)::TransformD64_4way = (code *)0x0;
  (anonymous_namespace)::TransformD64_8way = (code *)0x0;
  lVar5 = cpuid_Version_info(1);
  uVar2 = *(uint *)(lVar5 + 0xc);
  if ((use_implementation & USE_SSE4) != STANDARD && (uVar2 >> 0x13 & 1) != 0) {
    lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar1 = *(uint *)(lVar5 + 4);
    if (((byte)(uVar1 >> 0x1d) & 1 & use_implementation >> 2) == 1) {
      (anonymous_namespace)::Transform = sha256_x86_shani::Transform;
      (anonymous_namespace)::TransformD64 =
           anon_unknown.dwarf_5b1c29d::TransformD64Wrapper<&sha256_x86_shani::Transform>;
      (anonymous_namespace)::TransformD64_2way = sha256d64_x86_shani::Transform_2way;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,
                 "x86_shani(1way,2way)",0x14);
    }
    else {
      (anonymous_namespace)::Transform = sha256_sse4::Transform;
      (anonymous_namespace)::TransformD64 =
           anon_unknown.dwarf_5b1c29d::TransformD64Wrapper<&sha256_sse4::Transform>;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,"sse4(1way)",10);
      (anonymous_namespace)::TransformD64_4way = sha256d64_sse41::Transform_4way;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,",sse41(4way)");
      if ((((~uVar2 & 0x18000000) == 0 && (~in_XCR0 & 6) == 0) && (uVar2 >> 0x1c & 1) != 0) &&
          ((use_implementation & USE_AVX2) != STANDARD && (uVar1 & 0x20) != 0)) {
        (anonymous_namespace)::TransformD64_8way = sha256d64_avx2::Transform_8way;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,",avx2(8way)");
      }
    }
  }
  puVar4 = (anonymous_namespace)::SelfTest()::result;
  lVar5 = 0;
  do {
    local_158[0x10] = '\x7f';
    local_158[0x11] = 'R';
    local_158[0x12] = '\x0e';
    local_158[0x13] = 'Q';
    local_158[0x14] = 0x8c;
    local_158[0x15] = 'h';
    local_158[0x16] = '\x05';
    local_158[0x17] = 0x9b;
    local_158[0x18] = 0xab;
    local_158[0x19] = 0xd9;
    local_158[0x1a] = 0x83;
    local_158[0x1b] = '\x1f';
    local_158[0x1c] = '\x19';
    local_158[0x1d] = 0xcd;
    local_158[0x1e] = 0xe0;
    local_158[0x1f] = '[';
    local_158[0] = 'g';
    local_158[1] = 0xe6;
    local_158[2] = '\t';
    local_158[3] = 'j';
    local_158[4] = 0x85;
    local_158[5] = 0xae;
    local_158[6] = 'g';
    local_158[7] = 0xbb;
    local_158[8] = 'r';
    local_158[9] = 0xf3;
    local_158[10] = 'n';
    local_158[0xb] = '<';
    local_158[0xc] = ':';
    local_158[0xd] = 0xf5;
    local_158[0xe] = 'O';
    local_158[0xf] = 0xa5;
    (*(code *)(anonymous_namespace)::Transform)
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
               ,lVar5);
    auVar8[0] = -(puVar4[0x10] == local_158[0x10]);
    auVar8[1] = -(puVar4[0x11] == local_158[0x11]);
    auVar8[2] = -(puVar4[0x12] == local_158[0x12]);
    auVar8[3] = -(puVar4[0x13] == local_158[0x13]);
    auVar8[4] = -(puVar4[0x14] == local_158[0x14]);
    auVar8[5] = -(puVar4[0x15] == local_158[0x15]);
    auVar8[6] = -(puVar4[0x16] == local_158[0x16]);
    auVar8[7] = -(puVar4[0x17] == local_158[0x17]);
    auVar8[8] = -(puVar4[0x18] == local_158[0x18]);
    auVar8[9] = -(puVar4[0x19] == local_158[0x19]);
    auVar8[10] = -(puVar4[0x1a] == local_158[0x1a]);
    auVar8[0xb] = -(puVar4[0x1b] == local_158[0x1b]);
    auVar8[0xc] = -(puVar4[0x1c] == local_158[0x1c]);
    auVar8[0xd] = -(puVar4[0x1d] == local_158[0x1d]);
    auVar8[0xe] = -(puVar4[0x1e] == local_158[0x1e]);
    auVar8[0xf] = -(puVar4[0x1f] == local_158[0x1f]);
    auVar6[0] = -(*puVar4 == local_158[0]);
    auVar6[1] = -(puVar4[1] == local_158[1]);
    auVar6[2] = -(puVar4[2] == local_158[2]);
    auVar6[3] = -(puVar4[3] == local_158[3]);
    auVar6[4] = -(puVar4[4] == local_158[4]);
    auVar6[5] = -(puVar4[5] == local_158[5]);
    auVar6[6] = -(puVar4[6] == local_158[6]);
    auVar6[7] = -(puVar4[7] == local_158[7]);
    auVar6[8] = -(puVar4[8] == local_158[8]);
    auVar6[9] = -(puVar4[9] == local_158[9]);
    auVar6[10] = -(puVar4[10] == local_158[10]);
    auVar6[0xb] = -(puVar4[0xb] == local_158[0xb]);
    auVar6[0xc] = -(puVar4[0xc] == local_158[0xc]);
    auVar6[0xd] = -(puVar4[0xd] == local_158[0xd]);
    auVar6[0xe] = -(puVar4[0xe] == local_158[0xe]);
    auVar6[0xf] = -(puVar4[0xf] == local_158[0xf]);
    auVar6 = auVar6 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00e240f3;
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 0x20;
  } while (lVar5 != 9);
  (*(code *)(anonymous_namespace)::TransformD64)
            (&local_58,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
            );
  auVar9[0] = -(local_48 == -4);
  auVar9[1] = -(cStack_47 == 'R');
  auVar9[2] = -(cStack_46 == -0x29);
  auVar9[3] = -(cStack_45 == -0x25);
  auVar9[4] = -(cStack_44 == '\a');
  auVar9[5] = -(cStack_43 == 'c');
  auVar9[6] = -(cStack_42 == 'E');
  auVar9[7] = -(cStack_41 == -5);
  auVar9[8] = -(cStack_40 == 'S');
  auVar9[9] = -(cStack_3f == '\x14');
  auVar9[10] = -(cStack_3e == '}');
  auVar9[0xb] = -(cStack_3d == '\x17');
  auVar9[0xc] = -(cStack_3c == '\"');
  auVar9[0xd] = -(cStack_3b == -0x7a);
  auVar9[0xe] = -(cStack_3a == -0x10);
  auVar9[0xf] = -(cStack_39 == 'R');
  auVar7[0] = -(local_58 == '\t');
  auVar7[1] = -(cStack_57 == ':');
  auVar7[2] = -(cStack_56 == -0x3c);
  auVar7[3] = -(cStack_55 == -0x30);
  auVar7[4] = -(cStack_54 == '\x0f');
  auVar7[5] = -(cStack_53 == -9);
  auVar7[6] = -(cStack_52 == 'W');
  auVar7[7] = -(cStack_51 == -0x1f);
  auVar7[8] = -(cStack_50 == 'r');
  auVar7[9] = -(cStack_4f == -0x7b);
  auVar7[10] = -(cStack_4e == 'y');
  auVar7[0xb] = -(cStack_4d == 'B');
  auVar7[0xc] = -(cStack_4c == -2);
  auVar7[0xd] = -(cStack_4b == -0x19);
  auVar7[0xe] = -(cStack_4a == -0x20);
  auVar7[0xf] = -(cStack_49 == -0x60);
  auVar7 = auVar7 & auVar9;
  if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
LAB_00e240f3:
    __assert_fail("SelfTest()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/sha256.cpp"
                  ,0x2b2,"std::string SHA256AutoDetect(sha256_implementation::UseImplementation)");
  }
  if ((anonymous_namespace)::TransformD64_2way != (code *)0x0) {
    sha256d64_x86_shani::Transform_2way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x40);
    if (iVar3 != 0) goto LAB_00e240f3;
  }
  if ((anonymous_namespace)::TransformD64_4way != (code *)0x0) {
    sha256d64_sse41::Transform_4way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x80);
    if (iVar3 != 0) goto LAB_00e240f3;
  }
  if ((anonymous_namespace)::TransformD64_8way != (code *)0x0) {
    sha256d64_avx2::Transform_8way
              (local_158,
               "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Et molestie ac feugiat sed lectus vestibulum mattis ullamcorper. Morbi blandit cursus risus at ultrices mi tempus imperdiet nulla. Nunc congue nisi vita suscipit tellus mauris. Imperdiet proin fermentum leo vel orci. Massa tempor nec feugiat nisl pretium fusce id velit. Telus in metus vulputate eu scelerisque felis. Mi tempus imperdiet nulla malesuada pellentesque. Tristique magna sit."
              );
    iVar3 = bcmp(local_158,(anonymous_namespace)::SelfTest()::result_d64,0x100);
    if (iVar3 != 0) goto LAB_00e240f3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SHA256AutoDetect(sha256_implementation::UseImplementation use_implementation)
{
    std::string ret = "standard";
    Transform = sha256::Transform;
    TransformD64 = sha256::TransformD64;
    TransformD64_2way = nullptr;
    TransformD64_4way = nullptr;
    TransformD64_8way = nullptr;

#if !defined(DISABLE_OPTIMIZED_SHA256)
#if defined(HAVE_GETCPUID)
    bool have_sse4 = false;
    bool have_xsave = false;
    bool have_avx = false;
    [[maybe_unused]] bool have_avx2 = false;
    [[maybe_unused]] bool have_x86_shani = false;
    [[maybe_unused]] bool enabled_avx = false;

    uint32_t eax, ebx, ecx, edx;
    GetCPUID(1, 0, eax, ebx, ecx, edx);
    if (use_implementation & sha256_implementation::USE_SSE4) {
        have_sse4 = (ecx >> 19) & 1;
    }
    have_xsave = (ecx >> 27) & 1;
    have_avx = (ecx >> 28) & 1;
    if (have_xsave && have_avx) {
        enabled_avx = AVXEnabled();
    }
    if (have_sse4) {
        GetCPUID(7, 0, eax, ebx, ecx, edx);
        if (use_implementation & sha256_implementation::USE_AVX2) {
            have_avx2 = (ebx >> 5) & 1;
        }
        if (use_implementation & sha256_implementation::USE_SHANI) {
            have_x86_shani = (ebx >> 29) & 1;
        }
    }

#if defined(ENABLE_SSE41) && defined(ENABLE_X86_SHANI)
    if (have_x86_shani) {
        Transform = sha256_x86_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_x86_shani::Transform>;
        TransformD64_2way = sha256d64_x86_shani::Transform_2way;
        ret = "x86_shani(1way,2way)";
        have_sse4 = false; // Disable SSE4/AVX2;
        have_avx2 = false;
    }
#endif

    if (have_sse4) {
#if defined(__x86_64__) || defined(__amd64__)
        Transform = sha256_sse4::Transform;
        TransformD64 = TransformD64Wrapper<sha256_sse4::Transform>;
        ret = "sse4(1way)";
#endif
#if defined(ENABLE_SSE41)
        TransformD64_4way = sha256d64_sse41::Transform_4way;
        ret += ",sse41(4way)";
#endif
    }

#if defined(ENABLE_AVX2)
    if (have_avx2 && have_avx && enabled_avx) {
        TransformD64_8way = sha256d64_avx2::Transform_8way;
        ret += ",avx2(8way)";
    }
#endif
#endif // defined(HAVE_GETCPUID)

#if defined(ENABLE_ARM_SHANI)
    bool have_arm_shani = false;
    if (use_implementation & sha256_implementation::USE_SHANI) {
#if defined(__linux__)
#if defined(__arm__) // 32-bit
        if (getauxval(AT_HWCAP2) & HWCAP2_SHA2) {
            have_arm_shani = true;
        }
#endif
#if defined(__aarch64__) // 64-bit
        if (getauxval(AT_HWCAP) & HWCAP_SHA2) {
            have_arm_shani = true;
        }
#endif
#endif

#if defined(__APPLE__)
        int val = 0;
        size_t len = sizeof(val);
        if (sysctlbyname("hw.optional.arm.FEAT_SHA256", &val, &len, nullptr, 0) == 0) {
            have_arm_shani = val != 0;
        }
#endif
    }

    if (have_arm_shani) {
        Transform = sha256_arm_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_arm_shani::Transform>;
        TransformD64_2way = sha256d64_arm_shani::Transform_2way;
        ret = "arm_shani(1way,2way)";
    }
#endif
#endif // DISABLE_OPTIMIZED_SHA256

    assert(SelfTest());
    return ret;
}